

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O1

void __thiscall
prevector<8U,_int,_unsigned_int,_int>::assign
          (prevector<8U,_int,_unsigned_int,_int> *this,size_type n,int *val)

{
  int iVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  ulong uVar7;
  long lVar8;
  long in_FS_OFFSET;
  int iVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  int iVar13;
  undefined1 auVar12 [16];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  resize(this,0);
  uVar6 = 8;
  if (8 < this->_size) {
    uVar6 = (this->_union).indirect_contents.capacity;
  }
  if (uVar6 < n) {
    change_capacity(this,n);
  }
  uVar6 = this->_size + n;
  this->_size = uVar6;
  auVar5 = _DAT_00e98190;
  auVar4 = _DAT_00e98180;
  auVar3 = _DAT_00e98170;
  if (n != 0) {
    if (8 < uVar6) {
      this = (prevector<8U,_int,_unsigned_int,_int> *)(this->_union).indirect_contents.indirect;
    }
    iVar1 = *val;
    uVar7 = (ulong)n + 0x3fffffffffffffff & 0x3fffffffffffffff;
    auVar9._8_4_ = (int)uVar7;
    auVar9._0_8_ = uVar7;
    auVar9._12_4_ = (int)(uVar7 >> 0x20);
    lVar8 = 0;
    auVar9 = auVar9 ^ _DAT_00e98190;
    do {
      auVar11._8_4_ = (int)lVar8;
      auVar11._0_8_ = lVar8;
      auVar11._12_4_ = (int)((ulong)lVar8 >> 0x20);
      auVar12 = (auVar11 | auVar4) ^ auVar5;
      iVar10 = auVar9._4_4_;
      if ((bool)(~(auVar12._4_4_ == iVar10 && auVar9._0_4_ < auVar12._0_4_ || iVar10 < auVar12._4_4_
                  ) & 1)) {
        *(int *)((long)&this->_union + lVar8 * 4) = iVar1;
      }
      if ((auVar12._12_4_ != auVar9._12_4_ || auVar12._8_4_ <= auVar9._8_4_) &&
          auVar12._12_4_ <= auVar9._12_4_) {
        *(int *)((long)&this->_union + lVar8 * 4 + 4) = iVar1;
      }
      auVar11 = (auVar11 | auVar3) ^ auVar5;
      iVar13 = auVar11._4_4_;
      if (iVar13 <= iVar10 && (iVar13 != iVar10 || auVar11._0_4_ <= auVar9._0_4_)) {
        *(int *)((long)&this->_union + lVar8 * 4 + 8) = iVar1;
        *(int *)((long)&this->_union + lVar8 * 4 + 0xc) = iVar1;
      }
      lVar8 = lVar8 + 4;
    } while ((uVar7 - ((uint)((ulong)n + 0x3fffffffffffffff) & 3)) + 4 != lVar8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void assign(size_type n, const T& val) {
        clear();
        if (capacity() < n) {
            change_capacity(n);
        }
        _size += n;
        fill(item_ptr(0), n, val);
    }